

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  int *piVar3;
  __m256i alVar4;
  undefined1 auVar5 [32];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  __m256i *ptr;
  int64_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 uVar14;
  int iVar15;
  __m256i *palVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  ulong size;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  __m256i_64_t e;
  __m256i_64_t h;
  long local_1c0;
  long local_140;
  longlong local_a0 [4];
  longlong local_80 [10];
  undefined1 auVar62 [64];
  undefined1 auVar96 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar1 = (profile->profile64).score;
    if (pvVar1 == (void *)0x0) {
      parasail_nw_table_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar21 = profile->s1Len;
        if ((int)uVar21 < 1) {
          parasail_nw_table_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_scan_profile_avx2_256_64_cold_4();
        }
        else {
          uVar33 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_scan_profile_avx2_256_64_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_scan_profile_avx2_256_64_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_scan_profile_avx2_256_64_cold_1();
          }
          else {
            iVar6 = uVar21 - 1;
            size = (ulong)uVar21 + 3 >> 2;
            iVar35 = (int)size;
            uVar23 = CONCAT44(0,open);
            iVar15 = -open;
            iVar9 = ppVar2->min;
            uVar24 = 0x8000000000000000 - (long)iVar9;
            if (iVar9 != iVar15 && SBORROW4(iVar9,iVar15) == iVar9 + open < 0) {
              uVar24 = uVar23 | 0x8000000000000000;
            }
            iVar9 = ppVar2->max;
            ppVar10 = parasail_result_new_table1((uint)((ulong)uVar21 + 3) & 0x7ffffffc,s2Len);
            if (ppVar10 != (parasail_result_t *)0x0) {
              ppVar10->flag = ppVar10->flag | 0x4820401;
              ptr = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign___m256i(0x20,size);
              if (ptr_03 != (__m256i *)0x0 &&
                  ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                  (ptr_00 != (int64_t *)0x0 && ptr != (__m256i *)0x0))) {
                iVar7 = s2Len + -1;
                iVar8 = 3 - iVar6 / iVar35;
                auVar51._8_4_ = open;
                auVar51._0_8_ = uVar23;
                auVar51._12_4_ = 0;
                auVar51._16_4_ = open;
                auVar51._20_4_ = 0;
                auVar51._24_4_ = open;
                auVar51._28_4_ = 0;
                uVar30 = CONCAT44(0,gap);
                auVar52._8_4_ = gap;
                auVar52._0_8_ = uVar30;
                auVar52._12_4_ = 0;
                auVar52._16_4_ = gap;
                auVar52._20_4_ = 0;
                auVar52._24_4_ = gap;
                auVar52._28_4_ = 0;
                uVar24 = uVar24 + 1;
                lVar22 = 0x7ffffffffffffffe - (long)iVar9;
                auVar60._8_8_ = lVar22;
                auVar60._0_8_ = lVar22;
                auVar60._16_8_ = lVar22;
                auVar60._24_8_ = lVar22;
                auVar62 = ZEXT3264(auVar60);
                auVar41 = ZEXT864(uVar24);
                lVar22 = (long)-(gap * iVar35);
                auVar54._8_8_ = lVar22;
                auVar54._0_8_ = lVar22;
                auVar54._16_8_ = lVar22;
                auVar54._24_8_ = lVar22;
                auVar54 = vpblendd_avx2(auVar54,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
                auVar54 = vpaddq_avx2(ZEXT832(uVar24),auVar54);
                lVar22 = (long)iVar15;
                uVar25 = 0;
                do {
                  lVar27 = 0;
                  lVar26 = lVar22;
                  do {
                    local_80[lVar27] = lVar26;
                    local_a0[lVar27] = lVar26 - uVar23;
                    lVar27 = lVar27 + 1;
                    lVar26 = lVar26 - size * uVar30;
                  } while (lVar27 != 4);
                  palVar16 = ptr_02 + uVar25;
                  (*palVar16)[0] = local_80[0];
                  (*palVar16)[1] = local_80[1];
                  (*palVar16)[2] = local_80[2];
                  (*palVar16)[3] = local_80[3];
                  palVar16 = ptr + uVar25;
                  (*palVar16)[0] = local_a0[0];
                  (*palVar16)[1] = local_a0[1];
                  (*palVar16)[2] = local_a0[2];
                  (*palVar16)[3] = local_a0[3];
                  uVar25 = uVar25 + 1;
                  lVar22 = lVar22 - uVar30;
                } while (uVar25 != size);
                *ptr_00 = 0;
                lVar22 = (long)iVar15;
                uVar23 = 1;
                do {
                  ptr_00[uVar23] = lVar22;
                  uVar23 = uVar23 + 1;
                  lVar22 = lVar22 - uVar30;
                } while (s2Len + 1 != uVar23);
                alVar4 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar51);
                palVar16 = ptr_03 + (iVar35 - 1U);
                uVar23 = size;
                do {
                  *palVar16 = alVar4;
                  alVar4 = (__m256i)vpsubq_avx2((undefined1  [32])alVar4,auVar52);
                  palVar16 = palVar16 + -1;
                  iVar9 = (int)uVar23;
                  uVar21 = iVar9 - 1;
                  uVar23 = (ulong)uVar21;
                } while (uVar21 != 0 && 0 < iVar9);
                uVar23 = 1;
                if (1 < s2Len) {
                  uVar23 = uVar33;
                }
                lVar26 = (ulong)(iVar35 + (uint)(iVar35 == 0)) << 5;
                lVar22 = size * uVar33;
                local_140 = 0;
                uVar30 = 0;
                auVar58 = ZEXT3264(CONCAT824(uVar24,CONCAT816(uVar24,CONCAT88(uVar24,uVar24))));
                do {
                  auVar63 = SUB3216(ptr_02[iVar35 - 1U],0);
                  auVar77._0_16_ = ZEXT116(0) * auVar63 + ZEXT116(1) * auVar41._0_16_;
                  auVar77._16_16_ = ZEXT116(0) * auVar41._16_16_ + ZEXT116(1) * auVar63;
                  auVar77 = vpalignr_avx2((undefined1  [32])ptr_02[iVar35 - 1U],auVar77,8);
                  auVar77 = vpblendd_avx2(auVar77,ZEXT832((ulong)ptr_00[uVar30]),3);
                  iVar9 = ppVar2->mapper[(byte)s2[uVar30]];
                  auVar78._8_8_ = uVar24;
                  auVar78._0_8_ = uVar24;
                  auVar78._16_8_ = uVar24;
                  auVar78._24_8_ = uVar24;
                  auVar87 = vpsubq_avx2(auVar78,(undefined1  [32])*ptr_03);
                  lVar27 = 0;
                  do {
                    auVar96 = vpaddq_avx2(auVar77,*(undefined1 (*) [32])
                                                   ((long)pvVar1 +
                                                   lVar27 + (long)iVar9 * size * 0x20));
                    auVar77 = *(undefined1 (*) [32])((long)*ptr_02 + lVar27);
                    auVar47 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr + lVar27),auVar52);
                    auVar70 = vpsubq_avx2(auVar77,auVar51);
                    uVar25 = auVar70._0_8_;
                    if ((long)auVar70._0_8_ < (long)auVar47._0_8_) {
                      uVar25 = auVar47._0_8_;
                    }
                    uVar11 = vpextrq_avx(auVar47._0_16_,1);
                    uVar28 = vpextrq_avx(auVar70._0_16_,1);
                    if ((long)uVar28 < (long)uVar11) {
                      uVar28 = uVar11;
                    }
                    uVar11 = auVar70._16_8_;
                    if ((long)auVar70._16_8_ < (long)auVar47._16_8_) {
                      uVar11 = auVar47._16_8_;
                    }
                    uVar12 = vpextrq_avx(auVar47._16_16_,1);
                    uVar29 = vpextrq_avx(auVar70._16_16_,1);
                    if ((long)uVar29 < (long)uVar12) {
                      uVar29 = uVar12;
                    }
                    auVar87 = vpaddq_avx2(auVar87,*(undefined1 (*) [32])((long)*ptr_03 + lVar27));
                    uVar12 = auVar87._0_8_;
                    if ((long)auVar87._0_8_ < (long)auVar78._0_8_) {
                      uVar12 = auVar78._0_8_;
                    }
                    uVar17 = vpextrq_avx(auVar78._0_16_,1);
                    uVar13 = vpextrq_avx(auVar87._0_16_,1);
                    if ((long)uVar13 < (long)uVar17) {
                      uVar13 = uVar17;
                    }
                    uVar17 = auVar87._16_8_;
                    if ((long)auVar87._16_8_ < (long)auVar78._16_8_) {
                      uVar17 = auVar78._16_8_;
                    }
                    uVar36 = vpextrq_avx(auVar78._16_16_,1);
                    uVar18 = vpextrq_avx(auVar87._16_16_,1);
                    if ((long)uVar18 < (long)uVar36) {
                      uVar18 = uVar36;
                    }
                    uVar36 = uVar25;
                    if ((long)uVar25 <= (long)auVar96._0_8_) {
                      uVar36 = auVar96._0_8_;
                    }
                    uVar37 = vpextrq_avx(auVar96._0_16_,1);
                    uVar20 = uVar28;
                    if ((long)uVar28 <= (long)uVar37) {
                      uVar20 = uVar37;
                    }
                    uVar37 = uVar11;
                    if ((long)uVar11 <= (long)auVar96._16_8_) {
                      uVar37 = auVar96._16_8_;
                    }
                    uVar38 = vpextrq_avx(auVar96._16_16_,1);
                    uVar31 = uVar29;
                    if ((long)uVar29 <= (long)uVar38) {
                      uVar31 = uVar38;
                    }
                    auVar63._8_8_ = 0;
                    auVar63._0_8_ = uVar25;
                    auVar93._8_8_ = 0;
                    auVar93._0_8_ = uVar28;
                    auVar63 = vpunpcklqdq_avx(auVar63,auVar93);
                    auVar80._8_8_ = 0;
                    auVar80._0_8_ = uVar29;
                    auVar97._8_8_ = 0;
                    auVar97._0_8_ = uVar11;
                    auVar80 = vpunpcklqdq_avx(auVar97,auVar80);
                    auVar73._8_8_ = 0;
                    auVar73._0_8_ = uVar18;
                    auVar81._8_8_ = 0;
                    auVar81._0_8_ = uVar17;
                    auVar73 = vpunpcklqdq_avx(auVar81,auVar73);
                    auVar82._8_8_ = 0;
                    auVar82._0_8_ = uVar13;
                    auVar89._8_8_ = 0;
                    auVar89._0_8_ = uVar12;
                    auVar81 = vpunpcklqdq_avx(auVar89,auVar82);
                    auVar78._0_16_ = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar81;
                    auVar78._16_16_ = ZEXT116(1) * auVar73;
                    auVar83._8_8_ = 0;
                    auVar83._0_8_ = uVar36;
                    auVar90._8_8_ = 0;
                    auVar90._0_8_ = uVar20;
                    auVar73 = vpunpcklqdq_avx(auVar83,auVar90);
                    auVar94._8_8_ = 0;
                    auVar94._0_8_ = uVar37;
                    auVar96._0_16_ = ZEXT116(0) * auVar94 + ZEXT116(1) * auVar73;
                    auVar96._16_16_ = ZEXT116(1) * auVar94;
                    auVar87._8_8_ = uVar31;
                    auVar87._0_8_ = uVar31;
                    auVar87._16_8_ = uVar31;
                    auVar87._24_8_ = uVar31;
                    auVar87 = vpblendd_avx2(auVar96,auVar87,0xc0);
                    *(undefined1 (*) [16])((long)*ptr + lVar27 + 0x10) = auVar80;
                    *(undefined1 (*) [16])((long)*ptr + lVar27) = auVar63;
                    *(undefined1 (*) [32])((long)*ptr_01 + lVar27) = auVar87;
                    lVar27 = lVar27 + 0x20;
                  } while (lVar26 != lVar27);
                  auVar47._8_8_ = uVar20;
                  auVar47._0_8_ = uVar20;
                  auVar47._16_8_ = uVar20;
                  auVar47._24_8_ = uVar20;
                  auVar77 = vpunpcklqdq_avx2(auVar47,auVar96);
                  uVar25 = ptr_00[uVar30 + 1];
                  uVar30 = uVar30 + 1;
                  auVar77 = vpblendd_avx2(auVar77,ZEXT832(uVar25),3);
                  auVar77 = vpaddq_avx2(auVar77,(undefined1  [32])*ptr_03);
                  uVar28 = auVar77._0_8_;
                  if ((long)auVar77._0_8_ < (long)uVar12) {
                    uVar28 = uVar12;
                  }
                  uVar11 = vpextrq_avx(auVar77._0_16_,1);
                  if ((long)uVar11 < (long)uVar13) {
                    uVar11 = uVar13;
                  }
                  uVar29 = auVar77._16_8_;
                  if ((long)auVar77._16_8_ < (long)uVar17) {
                    uVar29 = uVar17;
                  }
                  uVar12 = vpextrq_avx(auVar77._16_16_,1);
                  if ((long)uVar12 < (long)uVar18) {
                    uVar12 = uVar18;
                  }
                  auVar42._8_8_ = 0;
                  auVar42._0_8_ = uVar12;
                  auVar64._8_8_ = 0;
                  auVar64._0_8_ = uVar29;
                  auVar63 = vpunpcklqdq_avx(auVar64,auVar42);
                  auVar65._8_8_ = 0;
                  auVar65._0_8_ = uVar11;
                  auVar74._8_8_ = 0;
                  auVar74._0_8_ = uVar28;
                  auVar80 = vpunpcklqdq_avx(auVar74,auVar65);
                  auVar70._0_16_ = ZEXT116(0) * auVar63 + ZEXT116(1) * auVar80;
                  auVar70._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar63;
                  iVar9 = 1;
                  do {
                    auVar77 = vperm2i128_avx2(auVar70,auVar70,8);
                    auVar77 = vpalignr_avx2(auVar70,auVar77,8);
                    auVar77 = vpaddq_avx2(auVar54,auVar77);
                    uVar28 = auVar77._0_8_;
                    if ((long)auVar77._0_8_ < (long)auVar70._0_8_) {
                      uVar28 = auVar70._0_8_;
                    }
                    uVar29 = vpextrq_avx(auVar70._0_16_,1);
                    uVar11 = vpextrq_avx(auVar77._0_16_,1);
                    if ((long)uVar11 < (long)uVar29) {
                      uVar11 = uVar29;
                    }
                    uVar29 = auVar77._16_8_;
                    if ((long)auVar77._16_8_ < (long)auVar70._16_8_) {
                      uVar29 = auVar70._16_8_;
                    }
                    auVar75._8_8_ = 0;
                    auVar75._0_8_ = uVar11;
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = uVar28;
                    auVar63 = vpunpcklqdq_avx(auVar84,auVar75);
                    lVar19 = vpextrq_avx(auVar70._16_16_,1);
                    lVar27 = vpextrq_avx(auVar77._16_16_,1);
                    auVar91._8_8_ = 0;
                    auVar91._0_8_ = uVar29;
                    auVar88._0_16_ = ZEXT116(0) * auVar91 + ZEXT116(1) * auVar63;
                    auVar88._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar91;
                    if (lVar27 < lVar19) {
                      lVar27 = lVar19;
                    }
                    auVar48._8_8_ = lVar27;
                    auVar48._0_8_ = lVar27;
                    auVar48._16_8_ = lVar27;
                    auVar48._24_8_ = lVar27;
                    auVar70 = vpblendd_avx2(auVar88,auVar48,0xc0);
                    iVar9 = iVar9 + -1;
                  } while (iVar9 == 0);
                  auVar43._8_8_ = uVar11;
                  auVar43._0_8_ = uVar11;
                  auVar49._16_16_ = ZEXT116(1) * auVar43;
                  auVar49._0_16_ = ZEXT116(0) * auVar43;
                  auVar77 = vpalignr_avx2(auVar88,auVar49,8);
                  auVar79 = vpaddq_avx2(auVar77,ZEXT832(uVar24));
                  uVar28 = auVar79._0_8_;
                  if ((long)auVar79._0_8_ < (long)uVar25) {
                    uVar28 = uVar25;
                  }
                  uVar25 = vpextrq_avx(auVar79._0_16_,1);
                  if ((long)uVar25 < (long)uVar36) {
                    uVar25 = uVar36;
                  }
                  uVar11 = auVar79._16_8_;
                  if ((long)auVar79._16_8_ < (long)uVar20) {
                    uVar11 = uVar20;
                  }
                  uVar29 = vpextrq_avx(auVar79._16_16_,1);
                  if ((long)uVar29 < (long)uVar37) {
                    uVar29 = uVar37;
                  }
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = uVar29;
                  auVar66._8_8_ = 0;
                  auVar66._0_8_ = uVar11;
                  auVar63 = vpunpcklqdq_avx(auVar66,auVar44);
                  auVar67._8_8_ = 0;
                  auVar67._0_8_ = uVar25;
                  auVar85._8_8_ = 0;
                  auVar85._0_8_ = uVar28;
                  auVar80 = vpunpcklqdq_avx(auVar85,auVar67);
                  auVar71._0_16_ = ZEXT116(0) * auVar63 + ZEXT116(1) * auVar80;
                  auVar71._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar63;
                  local_1c0 = local_140;
                  lVar27 = 0;
                  do {
                    auVar77 = vpsubq_avx2(auVar79,auVar52);
                    auVar87 = vpsubq_avx2(auVar71,auVar51);
                    uVar25 = auVar87._0_8_;
                    if ((long)auVar87._0_8_ < (long)auVar77._0_8_) {
                      uVar25 = auVar77._0_8_;
                    }
                    uVar11 = vpextrq_avx(auVar77._0_16_,1);
                    uVar28 = vpextrq_avx(auVar87._0_16_,1);
                    if ((long)uVar28 < (long)uVar11) {
                      uVar28 = uVar11;
                    }
                    uVar11 = auVar87._16_8_;
                    if ((long)auVar87._16_8_ < (long)auVar77._16_8_) {
                      uVar11 = auVar77._16_8_;
                    }
                    uVar12 = vpextrq_avx(auVar77._16_16_,1);
                    uVar29 = vpextrq_avx(auVar87._16_16_,1);
                    if ((long)uVar29 < (long)uVar12) {
                      uVar29 = uVar12;
                    }
                    uVar12 = *(ulong *)((long)*ptr_01 + lVar27);
                    uVar13 = uVar25;
                    if ((long)uVar25 < (long)uVar12) {
                      uVar13 = uVar12;
                    }
                    uVar12 = *(ulong *)((long)*ptr_01 + lVar27 + 8);
                    uVar17 = uVar28;
                    if ((long)uVar28 < (long)uVar12) {
                      uVar17 = uVar12;
                    }
                    uVar12 = *(ulong *)((long)*ptr_01 + lVar27 + 0x10);
                    uVar18 = uVar11;
                    if ((long)uVar11 < (long)uVar12) {
                      uVar18 = uVar12;
                    }
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = uVar17;
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = uVar13;
                    auVar63 = vpunpcklqdq_avx(auVar68,auVar45);
                    uVar12 = *(ulong *)((long)*ptr_01 + lVar27 + 0x18);
                    uVar36 = uVar29;
                    if ((long)uVar29 < (long)uVar12) {
                      uVar36 = uVar12;
                    }
                    auVar69._8_8_ = 0;
                    auVar69._0_8_ = uVar18;
                    auVar50._0_16_ = ZEXT116(0) * auVar69 + ZEXT116(1) * auVar63;
                    auVar50._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar69;
                    auVar72._8_8_ = uVar36;
                    auVar72._0_8_ = uVar36;
                    auVar72._16_8_ = uVar36;
                    auVar72._24_8_ = uVar36;
                    auVar71 = vpblendd_avx2(auVar50,auVar72,0xc0);
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar27) = auVar71;
                    uVar12 = auVar62._0_8_;
                    if ((long)uVar13 <= (long)auVar62._0_8_) {
                      uVar12 = uVar13;
                    }
                    uVar20 = vpextrq_avx(auVar62._0_16_,1);
                    if ((long)uVar17 <= (long)uVar20) {
                      uVar20 = uVar17;
                    }
                    uVar37 = auVar62._16_8_;
                    if ((long)uVar18 <= (long)auVar62._16_8_) {
                      uVar37 = uVar18;
                    }
                    uVar31 = vpextrq_avx(auVar62._16_16_,1);
                    if ((long)uVar36 <= (long)uVar31) {
                      uVar31 = uVar36;
                    }
                    uVar38 = auVar58._0_8_;
                    if ((long)auVar58._0_8_ <= (long)uVar13) {
                      uVar38 = uVar13;
                    }
                    uVar34 = vpextrq_avx(auVar58._0_16_,1);
                    if ((long)uVar34 <= (long)uVar17) {
                      uVar34 = uVar17;
                    }
                    uVar32 = auVar58._16_8_;
                    if ((long)auVar58._16_8_ <= (long)uVar18) {
                      uVar32 = uVar18;
                    }
                    uVar39 = vpextrq_avx(auVar58._16_16_,1);
                    piVar3 = ((ppVar10->field_4).rowcols)->score_row;
                    *(int *)((long)piVar3 + local_1c0) = (int)uVar13;
                    if ((long)uVar39 <= (long)uVar36) {
                      uVar39 = uVar36;
                    }
                    *(int *)((long)piVar3 + lVar22 * 4 + local_1c0) = (int)uVar17;
                    *(int *)((long)piVar3 + lVar22 * 8 + local_1c0) = (int)uVar18;
                    *(int *)((long)piVar3 + lVar22 * 0xc + local_1c0) = (int)uVar36;
                    auVar76._8_8_ = 0;
                    auVar76._0_8_ = uVar29;
                    auVar86._8_8_ = 0;
                    auVar86._0_8_ = uVar11;
                    auVar63 = vpunpcklqdq_avx(auVar86,auVar76);
                    auVar92._8_8_ = 0;
                    auVar92._0_8_ = uVar28;
                    auVar95._8_8_ = 0;
                    auVar95._0_8_ = uVar25;
                    auVar80 = vpunpcklqdq_avx(auVar95,auVar92);
                    auVar79._0_16_ = ZEXT116(0) * auVar63 + ZEXT116(1) * auVar80;
                    auVar79._16_16_ = ZEXT116(1) * auVar63;
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = uVar31;
                    auVar56._8_8_ = 0;
                    auVar56._0_8_ = uVar37;
                    auVar63 = vpunpcklqdq_avx(auVar56,auVar46);
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = uVar20;
                    auVar98._8_8_ = 0;
                    auVar98._0_8_ = uVar12;
                    auVar80 = vpunpcklqdq_avx(auVar98,auVar59);
                    auVar61._0_16_ = ZEXT116(0) * auVar63 + ZEXT116(1) * auVar80;
                    auVar61._16_16_ = ZEXT116(1) * auVar63;
                    auVar62 = ZEXT3264(auVar61);
                    auVar55._8_8_ = 0;
                    auVar55._0_8_ = uVar32;
                    auVar99._8_8_ = 0;
                    auVar99._0_8_ = uVar39;
                    auVar63 = vpunpcklqdq_avx(auVar55,auVar99);
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = uVar38;
                    auVar53._8_8_ = 0;
                    auVar53._0_8_ = uVar34;
                    auVar80 = vpunpcklqdq_avx(auVar40,auVar53);
                    auVar41 = ZEXT1664(auVar80);
                    auVar57._0_16_ = ZEXT116(0) * auVar63 + ZEXT116(1) * auVar80;
                    auVar57._16_16_ = ZEXT116(1) * auVar63;
                    auVar58 = ZEXT3264(auVar57);
                    lVar27 = lVar27 + 0x20;
                    local_1c0 = local_1c0 + uVar33 * 4;
                  } while (lVar26 != lVar27);
                  local_140 = local_140 + 4;
                } while (uVar30 != uVar23);
                alVar4 = ptr_02[(uint)(iVar6 % iVar35)];
                auVar63 = alVar4._16_16_;
                if (iVar6 / iVar35 < 3) {
                  iVar9 = 1;
                  if (1 < iVar8) {
                    iVar9 = iVar8;
                  }
                  do {
                    auVar54 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                    alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar54,8);
                    auVar63 = alVar4._16_16_;
                    iVar9 = iVar9 + -1;
                  } while (iVar9 != 0);
                }
                auVar5._8_8_ = uVar24;
                auVar5._0_8_ = uVar24;
                auVar5._16_8_ = uVar24;
                auVar5._24_8_ = uVar24;
                auVar54 = vpcmpgtq_avx2(auVar5,auVar61);
                auVar51 = vpcmpgtq_avx2(auVar57,auVar60);
                auVar54 = vpor_avx2(auVar51,auVar54);
                if ((((auVar54 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     SUB321(auVar54 >> 0x7f,0) == '\0') && SUB321(auVar54 >> 0xbf,0) == '\0') &&
                    -1 < auVar54[0x1f]) {
                  uVar14 = vpextrq_avx(auVar63,1);
                  iVar9 = (int)uVar14;
                }
                else {
                  *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                  iVar9 = 0;
                  iVar7 = 0;
                  iVar6 = 0;
                }
                ppVar10->score = iVar9;
                ppVar10->end_query = iVar6;
                ppVar10->end_ref = iVar7;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar10;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}